

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void aa1test(void)

{
  int N_00;
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  FILE *__stream;
  double *y;
  void *__ptr_01;
  void *__ptr_02;
  aa_ret_object obj_00;
  double temp2 [1200];
  double temp1 [1200];
  double temp [1200];
  FILE *ifp;
  int stepwise;
  int approx;
  char *ic;
  int seasonal [3];
  int order [3];
  int imean;
  aa_ret_object obj;
  double *newxreg;
  double *xreg;
  double *amse;
  double *xpred;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  _stepwise = "aicc";
  ifp._4_4_ = 0;
  ifp._0_4_ = 0;
  __ptr = malloc(0);
  __ptr_00 = malloc(0);
  __stream = fopen("../data/seriesB.txt","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf \n",temp1 + (long)d + 0x4af);
      d = d + 1;
    }
    y = (double *)malloc((long)d << 3);
    __ptr_01 = malloc((long)d << 4);
    __ptr_02 = malloc(0);
    for (d = 0; d < N_00; d = d + 1) {
      y[d] = temp1[(long)d + 0x4af];
    }
    for (d = 0; d < 0; d = d + 1) {
      *(double *)((long)__ptr_02 + (long)d * 8) = temp2[(long)(N_00 + d) + 0x4af];
      *(double *)((long)__ptr_02 + (long)d * 8) = temp2[(long)(N_00 + d) + -1];
    }
    obj_00 = auto_arima1(y,N_00,(int *)0x0,(int *)0x0,(int *)0x0,0,(int *)0x0,(int *)0x0,(int *)0x0,
                         (int *)0x0,(int *)0x0,_stepwise,(int *)&ifp,(int *)0x0,
                         (int *)((long)&ifp + 4),(int *)0x0,(double *)0x0,0,"kpss","level",
                         (double *)0x0,"seas",(double *)0x0,(int *)0x0,(int *)0x0,0,(double *)0x0);
    aa_ret_summary(obj_00);
    free(y);
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr_02);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void aa1test() {
	int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse,*xreg,*newxreg;
	aa_ret_object obj;
	int imean = 1;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	
	s = 0;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};
	const char *ic = "aicc";
	int approx = 0;
	int stepwise = 0;


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
    double temp1[1200];
    double temp2[1200];

	ifp = fopen("../data/seriesB.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf \n", &temp[i]);
		i++;
	}
	N = i - L;

	inp = (double*)malloc(sizeof(double)* N);
    xreg = (double*)malloc(sizeof(double)* N * 2);
    newxreg = (double*)malloc(sizeof(double)* L * 2);

    /*
    
    */

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
        //xreg[i] = temp1[i];
		//xreg[N+i] = temp2[i];
	}

    for(i = 0; i < L;++i) {
        newxreg[i] = temp1[N + i];
        newxreg[i+L] = temp2[N + i];
    }


	//obj = sarimax_init(p, d, q, P, D, Q, s, r , N);
	//obj = myarima(inp,N,order,seasonal, constant, ic, trace, approx, offset,xreg, r, &rmethod) ;
	obj = auto_arima1(inp, N,NULL,NULL,NULL,s,NULL,NULL,NULL,NULL,NULL, ic, &stepwise,NULL,&approx,NULL,NULL,r, "kpss","level", NULL, "seas", NULL, NULL, NULL,0,NULL);

	aa_ret_summary(obj);

    /* setMethod()
    Method 0 ("CSS-MLE") is default. The method also accepts values 1 ("MLE") and 2 ("CSS")
    */

	//sarimax_setMethod(obj, 0); 

    /*sarimax_exec(object, input time series, exogenous time series)
        set exogenous to NULL if deadling only with a univariate time series.
    */
	//sarimax_exec(obj, inp,xreg);
	

	free(inp);
	free(xpred);
	free(amse);
    free(xreg);
    free(newxreg);
}